

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFormat.h
# Opt level: O0

void __thiscall ser::FileFormat::~FileFormat(FileFormat *this)

{
  FileFormat *this_local;
  
  this->_vptr_FileFormat = (_func_int **)&PTR__FileFormat_00170bc0;
  std::__cxx11::string::~string((string *)&this->prefix_);
  std::__cxx11::string::~string((string *)&this->directory_);
  return;
}

Assistant:

virtual ~FileFormat() { }